

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O1

int qc_tcp_bind(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  int *__ptr;
  ssize_t sVar2;
  uint extraout_EDX;
  int extraout_EDX_00;
  ulong unaff_RBX;
  int iVar3;
  QcSocket *pQVar4;
  char *unaff_R14;
  sockaddr sStack_98;
  ulong uStack_88;
  socklen_t sStack_64;
  sockaddr sStack_60;
  ulong uStack_50;
  code *pcStack_48;
  code *pcStack_40;
  sockaddr local_30;
  
  if (socket == (QcSocket *)0x0) {
    pcStack_40 = (code *)0x109d17;
    qc_tcp_bind_cold_3();
LAB_00109d17:
    pcStack_40 = (code *)0x109d1c;
    qc_tcp_bind_cold_2();
  }
  else {
    unaff_R14 = ip;
    if (ip == (char *)0x0) goto LAB_00109d17;
    unaff_RBX = (ulong)(uint)port;
    if (0 < port) {
      local_30.sa_family = 2;
      local_30.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
      pcStack_40 = (code *)0x109cb2;
      iVar1 = strcmp(ip,"127.0.0.1");
      iVar3 = 0;
      local_30.sa_data._2_4_ = 0;
      if (iVar1 != 0) {
        pcStack_40 = (code *)0x109cc7;
        local_30.sa_data._2_4_ = inet_addr(ip);
      }
      pcStack_40 = (code *)0x109cdc;
      iVar1 = bind(socket->sockfd,&local_30,0x10);
      if (iVar1 != 0) {
        pcStack_40 = (code *)0x109d00;
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0x8d,"socket bind failed (ip=%s port=%d)",ip,(ulong)(uint)port);
        iVar3 = -1;
      }
      return iVar3;
    }
  }
  pcStack_40 = qc_tcp_listen;
  qc_tcp_bind_cold_1();
  if (socket != (QcSocket *)0x0) {
    pcStack_48 = (code *)0x109d33;
    iVar1 = listen(socket->sockfd,0x1000);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      pcStack_48 = (code *)0x109d4f;
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0x9b,"socket listen failed");
      iVar1 = -1;
    }
    return iVar1;
  }
  pcStack_48 = qc_tcp_accept;
  qc_tcp_listen_cold_1();
  uStack_50 = unaff_RBX;
  pcStack_48 = (code *)unaff_R14;
  if (socket == (QcSocket *)0x0) {
    qc_tcp_accept_cold_2();
    pQVar4 = socket;
  }
  else {
    pQVar4 = (QcSocket *)0x4;
    __ptr = (int *)malloc(4);
    if (__ptr != (int *)0x0) {
      *__ptr = 0;
      sStack_64 = 0x10;
      iVar1 = accept(socket->sockfd,&sStack_60,&sStack_64);
      *__ptr = iVar1;
      if (iVar1 < 0) {
        _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xb2,"socket accept failed");
        free(__ptr);
        __ptr = (int *)0x0;
      }
      return (int)__ptr;
    }
  }
  qc_tcp_accept_cold_1();
  uStack_88 = unaff_RBX;
  if (pQVar4 == (QcSocket *)0x0) {
    qc_tcp_connect_cold_3();
  }
  else if (ip != (char *)0x0) {
    if (0 < (int)extraout_EDX) {
      sStack_98.sa_family = 2;
      sStack_98.sa_data._0_2_ = (ushort)extraout_EDX << 8 | (ushort)extraout_EDX >> 8;
      sStack_98.sa_data._2_4_ = inet_addr(ip);
      iVar1 = connect(pQVar4->sockfd,&sStack_98,0x10);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                   ,0xc9,"tcp connect failed (ip=%s, port=%d)",ip,(ulong)extraout_EDX);
        iVar1 = -1;
      }
      return iVar1;
    }
    goto LAB_00109e74;
  }
  qc_tcp_connect_cold_2();
LAB_00109e74:
  qc_tcp_connect_cold_1();
  sVar2 = send(pQVar4->sockfd,ip,(long)extraout_EDX_00,0x4000);
  return (int)sVar2;
}

Assistant:

int qc_tcp_bind(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in servaddr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    servaddr.sin_family = AF_INET;
    servaddr.sin_port = htons(port);

    if(NULL == ip || (0 == strcmp(ip, "127.0.0.1")))
        servaddr.sin_addr.s_addr = htonl(INADDR_ANY);
    else
        servaddr.sin_addr.s_addr = inet_addr(ip);

    if(0 != bind(socket->sockfd, (struct sockaddr*)&servaddr, sizeof(servaddr)))
    {
        qc_perror("socket bind failed (ip=%s port=%d)", ip, port);
        return -1;
    }

    return 0;
}